

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O1

void embree::sse42::InstanceIntersectorK<4>::intersect
               (vbool<4> *valid_i,Precalculations *pre,RayHitK<4> *ray,RayQueryContext *context,
               Primitive *prim)

{
  uint uVar1;
  Instance *pIVar2;
  RTCRayQueryContext *pRVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  int iVar52;
  undefined1 auVar53 [16];
  RayQueryContext newcontext;
  undefined1 local_38 [16];
  long local_28;
  RTCRayQueryContext *local_20;
  RTCIntersectArguments *local_18;
  
  pIVar2 = prim->instance;
  uVar1 = (pIVar2->super_Geometry).mask;
  auVar53._0_4_ = -(uint)((uVar1 & *(uint *)(ray + 0x90)) == 0);
  auVar53._4_4_ = -(uint)((uVar1 & *(uint *)(ray + 0x94)) == 0);
  auVar53._8_4_ = -(uint)((uVar1 & *(uint *)(ray + 0x98)) == 0);
  auVar53._12_4_ = -(uint)((uVar1 & *(uint *)(ray + 0x9c)) == 0);
  local_38 = ~auVar53 & (undefined1  [16])valid_i->field_0;
  iVar52 = movmskps((int)ray,local_38);
  if ((iVar52 != 0) && (pRVar3 = context->user, pRVar3->instID[0] == 0xffffffff)) {
    pRVar3->instID[0] = prim->instID_;
    pRVar3->instPrimID[0] = 0;
    fVar4 = (pIVar2->world2local0).l.vx.field_0.m128[0];
    fVar5 = (pIVar2->world2local0).l.vx.field_0.m128[1];
    fVar6 = (pIVar2->world2local0).l.vx.field_0.m128[2];
    fVar7 = (pIVar2->world2local0).l.vy.field_0.m128[0];
    fVar8 = (pIVar2->world2local0).l.vy.field_0.m128[1];
    fVar9 = (pIVar2->world2local0).l.vy.field_0.m128[2];
    fVar10 = (pIVar2->world2local0).l.vz.field_0.m128[0];
    fVar11 = (pIVar2->world2local0).l.vz.field_0.m128[1];
    fVar12 = (pIVar2->world2local0).l.vz.field_0.m128[2];
    fVar13 = (pIVar2->world2local0).p.field_0.m128[0];
    fVar14 = (pIVar2->world2local0).p.field_0.m128[1];
    fVar15 = (pIVar2->world2local0).p.field_0.m128[2];
    fVar16 = *(float *)ray;
    fVar17 = *(float *)(ray + 4);
    uVar40 = *(undefined8 *)ray;
    fVar18 = *(float *)(ray + 8);
    fVar19 = *(float *)(ray + 0xc);
    uVar41 = *(undefined8 *)(ray + 8);
    fVar20 = *(float *)(ray + 0x10);
    fVar21 = *(float *)(ray + 0x14);
    uVar42 = *(undefined8 *)(ray + 0x10);
    fVar22 = *(float *)(ray + 0x18);
    fVar23 = *(float *)(ray + 0x1c);
    uVar43 = *(undefined8 *)(ray + 0x18);
    fVar24 = *(float *)(ray + 0x20);
    fVar25 = *(float *)(ray + 0x24);
    uVar44 = *(undefined8 *)(ray + 0x20);
    fVar26 = *(float *)(ray + 0x28);
    fVar27 = *(float *)(ray + 0x2c);
    uVar45 = *(undefined8 *)(ray + 0x28);
    fVar28 = *(float *)(ray + 0x40);
    fVar29 = *(float *)(ray + 0x44);
    uVar46 = *(undefined8 *)(ray + 0x40);
    fVar30 = *(float *)(ray + 0x48);
    fVar31 = *(float *)(ray + 0x4c);
    uVar47 = *(undefined8 *)(ray + 0x48);
    fVar32 = *(float *)(ray + 0x50);
    fVar33 = *(float *)(ray + 0x54);
    uVar48 = *(undefined8 *)(ray + 0x50);
    fVar34 = *(float *)(ray + 0x58);
    fVar35 = *(float *)(ray + 0x5c);
    uVar49 = *(undefined8 *)(ray + 0x58);
    fVar36 = *(float *)(ray + 0x60);
    fVar37 = *(float *)(ray + 100);
    uVar50 = *(undefined8 *)(ray + 0x60);
    fVar38 = *(float *)(ray + 0x68);
    fVar39 = *(float *)(ray + 0x6c);
    uVar51 = *(undefined8 *)(ray + 0x68);
    *(float *)ray = fVar4 * fVar16 + fVar7 * fVar20 + fVar10 * fVar24 + fVar13;
    *(float *)(ray + 4) = fVar4 * fVar17 + fVar7 * fVar21 + fVar10 * fVar25 + fVar13;
    *(float *)(ray + 8) = fVar4 * fVar18 + fVar7 * fVar22 + fVar10 * fVar26 + fVar13;
    *(float *)(ray + 0xc) = fVar4 * fVar19 + fVar7 * fVar23 + fVar10 * fVar27 + fVar13;
    *(float *)(ray + 0x10) = fVar5 * fVar16 + fVar8 * fVar20 + fVar11 * fVar24 + fVar14;
    *(float *)(ray + 0x14) = fVar5 * fVar17 + fVar8 * fVar21 + fVar11 * fVar25 + fVar14;
    *(float *)(ray + 0x18) = fVar5 * fVar18 + fVar8 * fVar22 + fVar11 * fVar26 + fVar14;
    *(float *)(ray + 0x1c) = fVar5 * fVar19 + fVar8 * fVar23 + fVar11 * fVar27 + fVar14;
    *(float *)(ray + 0x20) = fVar6 * fVar16 + fVar9 * fVar20 + fVar12 * fVar24 + fVar15;
    *(float *)(ray + 0x24) = fVar6 * fVar17 + fVar9 * fVar21 + fVar12 * fVar25 + fVar15;
    *(float *)(ray + 0x28) = fVar6 * fVar18 + fVar9 * fVar22 + fVar12 * fVar26 + fVar15;
    *(float *)(ray + 0x2c) = fVar6 * fVar19 + fVar9 * fVar23 + fVar12 * fVar27 + fVar15;
    *(float *)(ray + 0x40) = fVar4 * fVar28 + fVar7 * fVar32 + fVar10 * fVar36;
    *(float *)(ray + 0x44) = fVar4 * fVar29 + fVar7 * fVar33 + fVar10 * fVar37;
    *(float *)(ray + 0x48) = fVar4 * fVar30 + fVar7 * fVar34 + fVar10 * fVar38;
    *(float *)(ray + 0x4c) = fVar4 * fVar31 + fVar7 * fVar35 + fVar10 * fVar39;
    *(float *)(ray + 0x50) = fVar5 * fVar28 + fVar8 * fVar32 + fVar11 * fVar36;
    *(float *)(ray + 0x54) = fVar5 * fVar29 + fVar8 * fVar33 + fVar11 * fVar37;
    *(float *)(ray + 0x58) = fVar5 * fVar30 + fVar8 * fVar34 + fVar11 * fVar38;
    *(float *)(ray + 0x5c) = fVar5 * fVar31 + fVar8 * fVar35 + fVar11 * fVar39;
    *(float *)(ray + 0x60) = fVar6 * fVar28 + fVar9 * fVar32 + fVar12 * fVar36;
    *(float *)(ray + 100) = fVar6 * fVar29 + fVar9 * fVar33 + fVar12 * fVar37;
    *(float *)(ray + 0x68) = fVar6 * fVar30 + fVar9 * fVar34 + fVar12 * fVar38;
    *(float *)(ray + 0x6c) = fVar6 * fVar31 + fVar9 * fVar35 + fVar12 * fVar39;
    local_28 = *(long *)&(pIVar2->super_Geometry).field_0x58;
    local_18 = context->args;
    local_20 = pRVar3;
    (**(code **)(local_28 + 0x98))(local_38,local_28 + 0x58,ray);
    *(undefined8 *)ray = uVar40;
    *(undefined8 *)(ray + 8) = uVar41;
    *(undefined8 *)(ray + 0x10) = uVar42;
    *(undefined8 *)(ray + 0x18) = uVar43;
    *(undefined8 *)(ray + 0x20) = uVar44;
    *(undefined8 *)(ray + 0x28) = uVar45;
    *(undefined8 *)(ray + 0x40) = uVar46;
    *(undefined8 *)(ray + 0x48) = uVar47;
    *(undefined8 *)(ray + 0x50) = uVar48;
    *(undefined8 *)(ray + 0x58) = uVar49;
    *(undefined8 *)(ray + 0x60) = uVar50;
    *(undefined8 *)(ray + 0x68) = uVar51;
    pRVar3->instID[0] = 0xffffffff;
    pRVar3->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceIntersectorK<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      vbool<K> valid = valid_i;
      const Instance* instance = prim.instance;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local();
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }